

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O0

ssize_t __thiscall
OpenMesh::IO::_PLYReader_::read(_PLYReader_ *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  char *pcVar4;
  mostream *pmVar5;
  ostream *poVar6;
  undefined8 uVar7;
  undefined4 in_register_00000034;
  bool result;
  undefined1 local_240 [8];
  fstream in;
  Options *_opt_local;
  BaseImporter *_bi_local;
  string *_filename_local;
  _PLYReader_ *this_local;
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_bin,_S_in);
  std::fstream::fstream(local_240,pcVar4,_Var2);
  bVar1 = std::fstream::is_open();
  if (((bVar1 & 1) == 0) || (bVar1 = std::ios::good(), (bVar1 & 1) == 0)) {
    pmVar5 = omerr();
    poVar6 = std::operator<<(&pmVar5->super_ostream,"[PLYReader] : cannot not open file ");
    poVar6 = std::operator<<(poVar6,(string *)CONCAT44(in_register_00000034,__fd));
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
  }
  else {
    iVar3 = (*(this->super_BaseReader)._vptr_BaseReader[6])(this,local_240,__buf,__nbytes);
    this_local._7_1_ = (byte)iVar3 & 1;
    std::fstream::close();
  }
  uVar7 = std::fstream::~fstream(local_240);
  return CONCAT71((int7)((ulong)uVar7 >> 8),this_local._7_1_);
}

Assistant:

bool _PLYReader_::read(const std::string& _filename, BaseImporter& _bi, Options& _opt) {

    std::fstream in(_filename.c_str(), (std::ios_base::binary | std::ios_base::in) );

    if (!in.is_open() || !in.good()) {
        omerr() << "[PLYReader] : cannot not open file " << _filename << std::endl;
        return false;
    }

    bool result = read(in, _bi, _opt);

    in.close();
    return result;
}